

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

void ImGui::RenderRectFilledWithHole
               (ImDrawList *draw_list,ImRect *outer,ImRect *inner,ImU32 col,float rounding)

{
  float *pfVar1;
  float fVar2;
  bool bVar3;
  bool bVar4;
  ImRect *pIVar5;
  uint uVar6;
  uint uVar7;
  ImVec2 local_ac;
  ImVec2 local_a4;
  ImVec2 local_9c;
  ImVec2 local_94;
  ImVec2 local_8c;
  ImVec2 local_84;
  ImVec2 local_7c;
  ImVec2 local_74;
  ImVec2 local_6c;
  ImVec2 local_64;
  ImVec2 local_5c;
  ImVec2 local_54;
  ImVec2 local_4c;
  ImVec2 local_44;
  ImVec2 local_3c;
  ImVec2 local_34;
  byte local_2c;
  byte local_2b;
  byte local_2a;
  byte local_29;
  float local_28;
  bool fill_D;
  bool fill_U;
  bool fill_R;
  bool fill_L;
  float rounding_local;
  ImU32 col_local;
  ImRect *inner_local;
  ImRect *outer_local;
  ImDrawList *draw_list_local;
  
  fVar2 = (inner->Min).x;
  bVar3 = fVar2 != (outer->Min).x;
  bVar4 = (outer->Min).x <= fVar2;
  local_29 = bVar4 && bVar3;
  local_2a = (inner->Max).x < (outer->Max).x;
  fVar2 = (inner->Min).y;
  pfVar1 = &(outer->Min).y;
  local_2b = *pfVar1 <= fVar2 && fVar2 != *pfVar1;
  local_2c = (inner->Max).y < (outer->Max).y;
  local_28 = rounding;
  _fill_D = col;
  _rounding_local = inner;
  inner_local = outer;
  outer_local = (ImRect *)draw_list;
  if (bVar4 && bVar3) {
    ImVec2::ImVec2(&local_34,(outer->Min).x,(inner->Min).y);
    ImVec2::ImVec2(&local_3c,(_rounding_local->Min).x,(_rounding_local->Max).y);
    uVar7 = 0x10;
    if ((local_2b & 1) != 0) {
      uVar7 = 0;
    }
    uVar6 = 0x40;
    if ((local_2c & 1) != 0) {
      uVar6 = 0;
    }
    ImDrawList::AddRectFilled(draw_list,&local_34,&local_3c,_fill_D,local_28,uVar7 | 0x100 | uVar6);
  }
  pIVar5 = outer_local;
  if ((local_2a & 1) != 0) {
    ImVec2::ImVec2(&local_44,(_rounding_local->Max).x,(_rounding_local->Min).y);
    ImVec2::ImVec2(&local_4c,(inner_local->Max).x,(_rounding_local->Max).y);
    uVar7 = 0x20;
    if ((local_2b & 1) != 0) {
      uVar7 = 0;
    }
    uVar6 = 0x80;
    if ((local_2c & 1) != 0) {
      uVar6 = 0;
    }
    ImDrawList::AddRectFilled
              ((ImDrawList *)pIVar5,&local_44,&local_4c,_fill_D,local_28,uVar7 | 0x100 | uVar6);
  }
  pIVar5 = outer_local;
  if ((local_2b & 1) != 0) {
    ImVec2::ImVec2(&local_54,(_rounding_local->Min).x,(inner_local->Min).y);
    ImVec2::ImVec2(&local_5c,(_rounding_local->Max).x,(_rounding_local->Min).y);
    uVar7 = 0x10;
    if ((local_29 & 1) != 0) {
      uVar7 = 0;
    }
    uVar6 = 0x20;
    if ((local_2a & 1) != 0) {
      uVar6 = 0;
    }
    ImDrawList::AddRectFilled
              ((ImDrawList *)pIVar5,&local_54,&local_5c,_fill_D,local_28,uVar7 | 0x100 | uVar6);
  }
  pIVar5 = outer_local;
  if ((local_2c & 1) != 0) {
    ImVec2::ImVec2(&local_64,(_rounding_local->Min).x,(_rounding_local->Max).y);
    ImVec2::ImVec2(&local_6c,(_rounding_local->Max).x,(inner_local->Max).y);
    uVar7 = 0x40;
    if ((local_29 & 1) != 0) {
      uVar7 = 0;
    }
    uVar6 = 0x80;
    if ((local_2a & 1) != 0) {
      uVar6 = 0;
    }
    ImDrawList::AddRectFilled
              ((ImDrawList *)pIVar5,&local_64,&local_6c,_fill_D,local_28,uVar7 | 0x100 | uVar6);
  }
  pIVar5 = outer_local;
  if (((local_29 & 1) != 0) && ((local_2b & 1) != 0)) {
    ImVec2::ImVec2(&local_74,(inner_local->Min).x,(inner_local->Min).y);
    ImVec2::ImVec2(&local_7c,(_rounding_local->Min).x,(_rounding_local->Min).y);
    ImDrawList::AddRectFilled((ImDrawList *)pIVar5,&local_74,&local_7c,_fill_D,local_28,0x10);
  }
  pIVar5 = outer_local;
  if (((local_2a & 1) != 0) && ((local_2b & 1) != 0)) {
    ImVec2::ImVec2(&local_84,(_rounding_local->Max).x,(inner_local->Min).y);
    ImVec2::ImVec2(&local_8c,(inner_local->Max).x,(_rounding_local->Min).y);
    ImDrawList::AddRectFilled((ImDrawList *)pIVar5,&local_84,&local_8c,_fill_D,local_28,0x20);
  }
  pIVar5 = outer_local;
  if (((local_29 & 1) != 0) && ((local_2c & 1) != 0)) {
    ImVec2::ImVec2(&local_94,(inner_local->Min).x,(_rounding_local->Max).y);
    ImVec2::ImVec2(&local_9c,(_rounding_local->Min).x,(inner_local->Max).y);
    ImDrawList::AddRectFilled((ImDrawList *)pIVar5,&local_94,&local_9c,_fill_D,local_28,0x40);
  }
  pIVar5 = outer_local;
  if (((local_2a & 1) != 0) && ((local_2c & 1) != 0)) {
    ImVec2::ImVec2(&local_a4,(_rounding_local->Max).x,(_rounding_local->Max).y);
    ImVec2::ImVec2(&local_ac,(inner_local->Max).x,(inner_local->Max).y);
    ImDrawList::AddRectFilled((ImDrawList *)pIVar5,&local_a4,&local_ac,_fill_D,local_28,0x80);
  }
  return;
}

Assistant:

void ImGui::RenderRectFilledWithHole(ImDrawList* draw_list, const ImRect& outer, const ImRect& inner, ImU32 col, float rounding)
{
    const bool fill_L = (inner.Min.x > outer.Min.x);
    const bool fill_R = (inner.Max.x < outer.Max.x);
    const bool fill_U = (inner.Min.y > outer.Min.y);
    const bool fill_D = (inner.Max.y < outer.Max.y);
    if (fill_L) draw_list->AddRectFilled(ImVec2(outer.Min.x, inner.Min.y), ImVec2(inner.Min.x, inner.Max.y), col, rounding, ImDrawFlags_RoundCornersNone | (fill_U ? 0 : ImDrawFlags_RoundCornersTopLeft)    | (fill_D ? 0 : ImDrawFlags_RoundCornersBottomLeft));
    if (fill_R) draw_list->AddRectFilled(ImVec2(inner.Max.x, inner.Min.y), ImVec2(outer.Max.x, inner.Max.y), col, rounding, ImDrawFlags_RoundCornersNone | (fill_U ? 0 : ImDrawFlags_RoundCornersTopRight)   | (fill_D ? 0 : ImDrawFlags_RoundCornersBottomRight));
    if (fill_U) draw_list->AddRectFilled(ImVec2(inner.Min.x, outer.Min.y), ImVec2(inner.Max.x, inner.Min.y), col, rounding, ImDrawFlags_RoundCornersNone | (fill_L ? 0 : ImDrawFlags_RoundCornersTopLeft)    | (fill_R ? 0 : ImDrawFlags_RoundCornersTopRight));
    if (fill_D) draw_list->AddRectFilled(ImVec2(inner.Min.x, inner.Max.y), ImVec2(inner.Max.x, outer.Max.y), col, rounding, ImDrawFlags_RoundCornersNone | (fill_L ? 0 : ImDrawFlags_RoundCornersBottomLeft) | (fill_R ? 0 : ImDrawFlags_RoundCornersBottomRight));
    if (fill_L && fill_U) draw_list->AddRectFilled(ImVec2(outer.Min.x, outer.Min.y), ImVec2(inner.Min.x, inner.Min.y), col, rounding, ImDrawFlags_RoundCornersTopLeft);
    if (fill_R && fill_U) draw_list->AddRectFilled(ImVec2(inner.Max.x, outer.Min.y), ImVec2(outer.Max.x, inner.Min.y), col, rounding, ImDrawFlags_RoundCornersTopRight);
    if (fill_L && fill_D) draw_list->AddRectFilled(ImVec2(outer.Min.x, inner.Max.y), ImVec2(inner.Min.x, outer.Max.y), col, rounding, ImDrawFlags_RoundCornersBottomLeft);
    if (fill_R && fill_D) draw_list->AddRectFilled(ImVec2(inner.Max.x, inner.Max.y), ImVec2(outer.Max.x, outer.Max.y), col, rounding, ImDrawFlags_RoundCornersBottomRight);
}